

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbMfs.c
# Opt level: O3

int Acb_ObjLabelTfo(Acb_Ntk_t *p,int Root,int nTfoLevMax,int nFanMax,int fDelay)

{
  uint uVar1;
  int iVar2;
  int *piVar3;
  uint uVar4;
  
  uVar4 = (p->vObjTrav).nSize;
  if ((int)uVar4 < 1) {
    uVar4 = (p->vObjType).nCap;
    uVar1 = (p->vObjTrav).nCap;
    if ((int)uVar1 < (int)uVar4) {
      piVar3 = (p->vObjTrav).pArray;
      if (piVar3 == (int *)0x0) {
        piVar3 = (int *)malloc((long)(int)uVar4 << 2);
      }
      else {
        piVar3 = (int *)realloc(piVar3,(long)(int)uVar4 << 2);
      }
      (p->vObjTrav).pArray = piVar3;
      if (piVar3 == (int *)0x0) goto LAB_003a39ab;
      (p->vObjTrav).nCap = uVar4;
      uVar1 = uVar4;
    }
    if ((int)uVar4 < 1) {
      (p->vObjTrav).nSize = uVar4;
      p->nObjTravs = p->nObjTravs + 1;
      uVar4 = (p->vObjType).nCap;
      if ((int)uVar1 < (int)uVar4) {
        piVar3 = (p->vObjTrav).pArray;
        if (piVar3 == (int *)0x0) {
          piVar3 = (int *)malloc((long)(int)uVar4 << 2);
        }
        else {
          piVar3 = (int *)realloc(piVar3,(long)(int)uVar4 << 2);
        }
        (p->vObjTrav).pArray = piVar3;
        if (piVar3 == (int *)0x0) goto LAB_003a39ab;
        (p->vObjTrav).nCap = uVar4;
      }
      if ((int)uVar4 < 1) {
        (p->vObjTrav).nSize = uVar4;
        p->nObjTravs = p->nObjTravs + 1;
        uVar4 = (p->vObjType).nCap;
        if ((p->vObjTrav).nCap < (int)uVar4) {
          piVar3 = (p->vObjTrav).pArray;
          if (piVar3 == (int *)0x0) {
            piVar3 = (int *)malloc((long)(int)uVar4 << 2);
          }
          else {
            piVar3 = (int *)realloc(piVar3,(long)(int)uVar4 << 2);
          }
          (p->vObjTrav).pArray = piVar3;
          if (piVar3 == (int *)0x0) {
LAB_003a39ab:
            __assert_fail("p->pArray",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                          ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
          }
          (p->vObjTrav).nCap = uVar4;
        }
        if (0 < (int)uVar4) {
          memset((p->vObjTrav).pArray,0,(ulong)uVar4 * 4);
        }
        (p->vObjTrav).nSize = uVar4;
        iVar2 = p->nObjTravs;
      }
      else {
        memset((p->vObjTrav).pArray,0,(ulong)uVar4 * 4);
        (p->vObjTrav).nSize = uVar4;
        iVar2 = p->nObjTravs + 1;
      }
      goto LAB_003a3804;
    }
    memset((p->vObjTrav).pArray,0,(ulong)uVar4 * 4);
    (p->vObjTrav).nSize = uVar4;
  }
  iVar2 = p->nObjTravs + 2;
LAB_003a3804:
  p->nObjTravs = iVar2 + 1;
  if ((-1 < Root) && (Root < (int)uVar4)) {
    if (2 < (iVar2 + 1) - (p->vObjTrav).pArray[(uint)Root]) {
      iVar2 = Acb_ObjLabelTfo_rec(p,Root,nTfoLevMax,nFanMax,fDelay);
      return iVar2;
    }
    __assert_fail("Acb_ObjTravIdDiff(p, Root) > 2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acbMfs.c"
                  ,600,"int Acb_ObjLabelTfo(Acb_Ntk_t *, int, int, int, int)");
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

int Acb_ObjLabelTfo( Acb_Ntk_t * p, int Root, int nTfoLevMax, int nFanMax, int fDelay )
{
    Acb_NtkIncTravId( p ); // none  (2)    marked (3)  unmarked (4)
    Acb_NtkIncTravId( p ); // root  (1)
    Acb_NtkIncTravId( p ); // inner (0)
    assert( Acb_ObjTravIdDiff(p, Root) > 2 );
    return Acb_ObjLabelTfo_rec( p, Root, nTfoLevMax, nFanMax, fDelay );
}